

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_parser.c
# Opt level: O0

gnode_t * parse_getter_setter(gravity_parser_t *parser)

{
  gravity_lexer_t *lexer_00;
  size_t sVar1;
  long lVar2;
  gtoken_s token_00;
  gtoken_s token_01;
  gtoken_s token_02;
  gtoken_s token_03;
  gtoken_s token_04;
  gtoken_t gVar3;
  int iVar4;
  char *__s1;
  gnode_t **ppgVar5;
  char *pcVar6;
  gnode_t *pgVar7;
  gnode_t *pgVar8;
  void *pvVar9;
  gnode_t *local_1e0;
  char *local_1d0;
  long local_1c8;
  gnode_t *local_1c0;
  size_t local_1b8;
  size_t local_1b0;
  gnode_t *local_1a8;
  gnode_t *local_198;
  size_t local_188;
  gnode_t *local_180;
  size_t local_170;
  gnode_t *local_168;
  size_t local_158;
  undefined1 local_150 [8];
  gtoken_s end_token;
  gnode_r *functions;
  gnode_compound_stmt_t *compound;
  gnode_t *f;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  char *local_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  char *local_a0;
  gnode_r *local_98;
  gnode_r *params;
  gtoken_s token;
  _Bool is_getter;
  char *identifier;
  gtoken_s token_block;
  gnode_t *setter;
  gnode_t *getter;
  gravity_lexer_t *lexer;
  gravity_parser_t *parser_local;
  
  lexer_00 = parser->lexer->p[parser->lexer->n - 1];
  setter = (gnode_t *)0x0;
  token_block.value = (char *)0x0;
  gravity_lexer_token((gtoken_s *)&identifier,lexer_00);
  pgVar7 = (gnode_t *)token_block.value;
  while( true ) {
    token_block.value = (char *)pgVar7;
    gVar3 = gravity_lexer_peek(lexer_00);
    if (gVar3 == TOK_OP_CLOSED_CURLYBRACE) {
      end_token.value = (char *)gnode_array_create();
      if (((gnode_r *)end_token.value)->n == ((gnode_r *)end_token.value)->m) {
        if (((gnode_r *)end_token.value)->m == 0) {
          local_1b8 = 8;
        }
        else {
          local_1b8 = ((gnode_r *)end_token.value)->m << 1;
        }
        ((gnode_r *)end_token.value)->m = local_1b8;
        pvVar9 = realloc(((gnode_r *)end_token.value)->p,((gnode_r *)end_token.value)->m << 3);
        *(void **)(end_token.value + 0x10) = pvVar9;
      }
      if (setter == (gnode_t *)0x0) {
        local_1c0 = (gnode_t *)0x0;
      }
      else {
        local_1c0 = setter;
      }
      lVar2 = *(long *)end_token.value;
      *(long *)end_token.value = lVar2 + 1;
      *(gnode_t **)(*(long *)(end_token.value + 0x10) + lVar2 * 8) = local_1c0;
      if (*(long *)end_token.value == *(long *)(end_token.value + 8)) {
        if (*(long *)(end_token.value + 8) == 0) {
          local_1c8 = 8;
        }
        else {
          local_1c8 = *(long *)(end_token.value + 8) << 1;
        }
        *(long *)(end_token.value + 8) = local_1c8;
        pvVar9 = realloc(*(void **)(end_token.value + 0x10),*(long *)(end_token.value + 8) << 3);
        *(void **)(end_token.value + 0x10) = pvVar9;
      }
      if (token_block.value == (char *)0x0) {
        local_1d0 = (char *)0x0;
      }
      else {
        local_1d0 = token_block.value;
      }
      lVar2 = *(long *)end_token.value;
      *(long *)end_token.value = lVar2 + 1;
      *(char **)(*(long *)(end_token.value + 0x10) + lVar2 * 8) = local_1d0;
      gravity_lexer_token((gtoken_s *)local_150,lexer_00);
      if (parser->declarations->n == 0) {
        local_1e0 = (gnode_t *)0x0;
      }
      else {
        local_1e0 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_04.position = token_block.lineno;
      token_04.colno = token_block.type;
      token_04._0_8_ = identifier;
      token_04.bytes = token_block.colno;
      token_04.length = token_block.position;
      token_04.fileid = token_block.bytes;
      token_04.builtin = token_block.length;
      token_04.value = (char *)token_block._24_8_;
      pgVar7 = gnode_block_stat_create
                         (NODE_COMPOUND_STAT,token_04,(gnode_r *)end_token.value,local_1e0,
                          (end_token.lineno + end_token.position) - token_block.lineno);
      return pgVar7;
    }
    __s1 = parse_identifier(parser);
    if (__s1 == (char *)0x0) break;
    token.value._7_1_ = 0;
    gravity_lexer_token((gtoken_s *)&params,lexer_00);
    local_98 = (gnode_r *)0x0;
    iVar4 = strcmp(__s1,"get");
    if (iVar4 == 0) {
      token.value._7_1_ = 1;
      local_98 = gnode_array_create();
      if (local_98->n == local_98->m) {
        if (local_98->m == 0) {
          local_158 = 8;
        }
        else {
          local_158 = local_98->m << 1;
        }
        local_98->m = local_158;
        ppgVar5 = (gnode_t **)realloc(local_98->p,local_98->m << 3);
        local_98->p = ppgVar5;
      }
      memset(&local_c0,0,0x28);
      pcVar6 = string_dup("self");
      if (parser->declarations->n == 0) {
        local_168 = (gnode_t *)0x0;
      }
      else {
        local_168 = parser->declarations->p[parser->declarations->n - 1];
      }
      token_00.colno = (undefined4)uStack_b8;
      token_00.position = uStack_b8._4_4_;
      token_00.type = (undefined4)local_c0;
      token_00.lineno = local_c0._4_4_;
      token_00.bytes = (undefined4)local_b0;
      token_00.length = local_b0._4_4_;
      token_00.fileid = (undefined4)uStack_a8;
      token_00.builtin = uStack_a8._4_4_;
      token_00.value = local_a0;
      pgVar7 = gnode_variable_create
                         (token_00,pcVar6,(char *)0x0,(gnode_t *)0x0,local_168,
                          (gnode_variable_decl_t *)0x0);
      sVar1 = local_98->n;
      local_98->n = sVar1 + 1;
      local_98->p[sVar1] = pgVar7;
    }
    iVar4 = strcmp(__s1,"set");
    if (iVar4 == 0) {
      token.value._7_1_ = 0;
      gVar3 = gravity_lexer_peek(lexer_00);
      if (gVar3 == TOK_OP_OPEN_PARENTHESIS) {
        parse_required(parser,TOK_OP_OPEN_PARENTHESIS);
        local_98 = parse_optional_parameter_declaration(parser,false,(_Bool *)0x0);
        parse_required(parser,TOK_OP_CLOSED_PARENTHESIS);
      }
      else {
        local_98 = gnode_array_create();
        if (local_98->n == local_98->m) {
          if (local_98->m == 0) {
            local_170 = 8;
          }
          else {
            local_170 = local_98->m << 1;
          }
          local_98->m = local_170;
          ppgVar5 = (gnode_t **)realloc(local_98->p,local_98->m << 3);
          local_98->p = ppgVar5;
        }
        memset(&local_e8,0,0x28);
        pcVar6 = string_dup("self");
        if (parser->declarations->n == 0) {
          local_180 = (gnode_t *)0x0;
        }
        else {
          local_180 = parser->declarations->p[parser->declarations->n - 1];
        }
        token_01.colno = (undefined4)uStack_e0;
        token_01.position = uStack_e0._4_4_;
        token_01.type = (undefined4)local_e8;
        token_01.lineno = local_e8._4_4_;
        token_01.bytes = (undefined4)local_d8;
        token_01.length = local_d8._4_4_;
        token_01.fileid = (undefined4)uStack_d0;
        token_01.builtin = uStack_d0._4_4_;
        token_01.value = local_c8;
        pgVar7 = gnode_variable_create
                           (token_01,pcVar6,(char *)0x0,(gnode_t *)0x0,local_180,
                            (gnode_variable_decl_t *)0x0);
        sVar1 = local_98->n;
        local_98->n = sVar1 + 1;
        local_98->p[sVar1] = pgVar7;
        if (local_98->n == local_98->m) {
          if (local_98->m == 0) {
            local_188 = 8;
          }
          else {
            local_188 = local_98->m << 1;
          }
          local_98->m = local_188;
          ppgVar5 = (gnode_t **)realloc(local_98->p,local_98->m << 3);
          local_98->p = ppgVar5;
        }
        memset(&f,0,0x28);
        pcVar6 = string_dup("value");
        if (parser->declarations->n == 0) {
          local_198 = (gnode_t *)0x0;
        }
        else {
          local_198 = parser->declarations->p[parser->declarations->n - 1];
        }
        token_02.colno = (undefined4)uStack_108;
        token_02.position = uStack_108._4_4_;
        token_02._0_8_ = f;
        token_02.bytes = (undefined4)local_100;
        token_02.length = local_100._4_4_;
        token_02.fileid = (undefined4)uStack_f8;
        token_02.builtin = uStack_f8._4_4_;
        token_02.value = local_f0;
        pgVar7 = gnode_variable_create
                           (token_02,pcVar6,(char *)0x0,(gnode_t *)0x0,local_198,
                            (gnode_variable_decl_t *)0x0);
        sVar1 = local_98->n;
        local_98->n = sVar1 + 1;
        local_98->p[sVar1] = pgVar7;
      }
    }
    free(__s1);
    if (parser->declarations->n == 0) {
      local_1a8 = (gnode_t *)0x0;
    }
    else {
      local_1a8 = parser->declarations->p[parser->declarations->n - 1];
    }
    token_03.colno = token.type;
    token_03.position = token.lineno;
    token_03._0_8_ = params;
    token_03.bytes = token.colno;
    token_03.length = token.position;
    token_03.fileid = token.bytes;
    token_03.builtin = token.length;
    token_03.value = (char *)token._24_8_;
    pgVar8 = gnode_function_decl_create
                       (token_03,(char *)0x0,TOK_EOF,TOK_EOF,local_98,(gnode_compound_stmt_t *)0x0,
                        local_1a8);
    *(undefined4 *)&pgVar8[1].field_0xc = 0x22;
    if (parser->declarations->n == parser->declarations->m) {
      if (parser->declarations->m == 0) {
        local_1b0 = 8;
      }
      else {
        local_1b0 = parser->declarations->m << 1;
      }
      parser->declarations->m = local_1b0;
      ppgVar5 = (gnode_t **)realloc(parser->declarations->p,parser->declarations->m << 3);
      parser->declarations->p = ppgVar5;
    }
    ppgVar5 = parser->declarations->p;
    sVar1 = parser->declarations->n;
    parser->declarations->n = sVar1 + 1;
    ppgVar5[sVar1] = pgVar8;
    pgVar7 = parse_compound_statement(parser);
    parser->declarations->n = parser->declarations->n - 1;
    *(gnode_t **)&pgVar8[1].token.fileid = pgVar7;
    pgVar7 = pgVar8;
    if ((token.value._7_1_ & 1) != 0) {
      pgVar7 = (gnode_t *)token_block.value;
      setter = pgVar8;
    }
  }
  return (gnode_t *)0x0;
}

Assistant:

static gnode_t *parse_getter_setter (gravity_parser_t *parser) {
    DEBUG_PARSER("parse_getter_setter");
    DECLARE_LEXER;

    gnode_t *getter = NULL;
    gnode_t *setter = NULL;
    gtoken_s token_block = gravity_lexer_token(lexer);

    while (gravity_lexer_peek(lexer) != TOK_OP_CLOSED_CURLYBRACE) {
        const char *identifier = parse_identifier(parser);
        if (!identifier) goto parse_error;

        bool is_getter = false;
        gtoken_s token = gravity_lexer_token(lexer);
        gnode_r *params = NULL;

        // getter case: does not have explicit parameters (only implicit self)
        if (strcmp(identifier, GETTER_FUNCTION_NAME) == 0) {
            is_getter = true;
            params = gnode_array_create();    // add implicit SELF param
            gnode_array_push(params, gnode_variable_create(NO_TOKEN, string_dup(SELF_PARAMETER_NAME), NULL, NULL, LAST_DECLARATION(), NULL));
        }

        // setter case: could have explicit parameters (otherwise value is implicit)
        if (strcmp(identifier, SETTER_FUNCTION_NAME) == 0) {
            is_getter = false;
            // check if parameters are explicit
            if (gravity_lexer_peek(lexer) == TOK_OP_OPEN_PARENTHESIS) {
                parse_required(parser, TOK_OP_OPEN_PARENTHESIS);
                params = parse_optional_parameter_declaration(parser, false, NULL);    // add implicit SELF
                parse_required(parser, TOK_OP_CLOSED_PARENTHESIS);
            } else {
                params = gnode_array_create();    // add implicit SELF and VALUE params
                gnode_array_push(params, gnode_variable_create(NO_TOKEN, string_dup(SELF_PARAMETER_NAME), NULL, NULL, LAST_DECLARATION(), NULL));
                gnode_array_push(params, gnode_variable_create(NO_TOKEN, string_dup(SETTER_PARAMETER_NAME), NULL, NULL, LAST_DECLARATION(), NULL));
            }
        }
        mem_free(identifier);

        // create getter/setter func declaration
        gnode_t *f = gnode_function_decl_create(token, NULL, 0, 0, params, NULL, LAST_DECLARATION());
        // set storage to var so I can identify f as a special getter/setter function
        ((gnode_function_decl_t *)f)->storage = TOK_KEY_VAR;

        // parse compound statement
        PUSH_DECLARATION(f);
        gnode_compound_stmt_t *compound = (gnode_compound_stmt_t*)parse_compound_statement(parser);
        POP_DECLARATION();

        // finish func setup
        ((gnode_function_decl_t *)f)->block = compound;

        // assign f to the right function
        if (is_getter) getter = f; else setter = f;
    }

    gnode_r *functions = gnode_array_create();
    gnode_array_push(functions, (getter) ? getter : NULL);    // getter is at index 0
    gnode_array_push(functions, (setter) ? setter : NULL);    // setter is at index 1

	// read current token to extract node total length
	gtoken_s end_token = gravity_lexer_token(lexer);
	
    // a compound node is used to capture getter and setter
    return gnode_block_stat_create(NODE_COMPOUND_STAT, token_block, functions, LAST_DECLARATION(), end_token.position + end_token.length - token_block.position);

parse_error:
    return NULL;
}